

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-skt.c
# Opt level: O0

int rops_client_bind_raw_skt(lws *wsi,lws_client_connect_info *i)

{
  int iVar1;
  lws_client_connect_info *i_local;
  lws *wsi_local;
  
  if (i == (lws_client_connect_info *)0x0) {
    if (((wsi->user_space == (void *)0x0) && (wsi->stash->cis[5] != (char *)0x0)) &&
       (iVar1 = lws_ensure_user_space(wsi), iVar1 != 0)) {
      wsi_local._4_4_ = 1;
    }
    else {
      wsi_local._4_4_ = 0;
    }
  }
  else {
    if ((i->local_protocol_name == (char *)0x0) ||
       (iVar1 = strcmp(i->local_protocol_name,"raw-proxy"), iVar1 != 0)) {
      lws_role_transition(wsi,0x10000000,LRS_UNCONNECTED,&role_ops_raw_skt);
    }
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_client_bind_raw_skt(struct lws *wsi,
			 const struct lws_client_connect_info *i)
{
	if (!i) {

		/* finalize */

		if (!wsi->user_space && wsi->stash->cis[CIS_METHOD])
			if (lws_ensure_user_space(wsi))
				return 1;

		return 0;
	}

	/* we are a fallback if nothing else matched */

	if (!i->local_protocol_name ||
	    strcmp(i->local_protocol_name, "raw-proxy"))
		lws_role_transition(wsi, LWSIFR_CLIENT, LRS_UNCONNECTED,
			    &role_ops_raw_skt);

	return 1; /* matched */
}